

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_>::FinishWriting
          (TPZParFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontSym<float>_> *this)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"FinishWriting");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  this->fFinish = 1;
  std::condition_variable::notify_all();
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::FinishWriting(){
	// FinishWriting already has a lock
	cout << endl << "FinishWriting" << endl;
	cout.flush();     
	fFinish = 1;
	// FinishWriting already has a lock
    fwritecond.notify_all();
}